

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  undefined1 (*pauVar3) [12];
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  bool bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  __m128i *palVar18;
  __m128i *palVar19;
  __m128i *palVar20;
  bool bVar21;
  size_t len;
  long lVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  __m128i *palVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  undefined4 in_register_00000084;
  long lVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar53;
  ulong uVar54;
  uint uVar61;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar60;
  uint uVar63;
  undefined1 auVar59 [16];
  ulong uVar62;
  uint uVar64;
  uint uVar67;
  uint uVar69;
  undefined1 auVar65 [16];
  uint uVar68;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  undefined1 auVar66 [16];
  uint uVar73;
  int iVar74;
  uint uVar77;
  uint uVar79;
  undefined1 auVar75 [16];
  int iVar78;
  int iVar80;
  uint uVar81;
  int iVar82;
  undefined1 auVar76 [16];
  int iVar83;
  int iVar86;
  int iVar87;
  int iVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar89 [16];
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint uVar102;
  int iVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  undefined1 local_208 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  long local_160;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  longlong extraout_RDX_00;
  
  len = CONCAT44(in_register_00000084,gap);
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_stats_table_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar25 = profile->s1Len;
        if ((int)uVar25 < 1) {
          parasail_nw_stats_table_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_scan_profile_sse41_128_32_cold_4();
        }
        else {
          uVar62 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_scan_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_scan_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_scan_profile_sse41_128_32_cold_1();
          }
          else {
            uVar28 = uVar25 - 1;
            uVar34 = (ulong)uVar25 + 3 >> 2;
            uVar35 = (ulong)uVar28 % uVar34;
            iVar31 = -open;
            iVar16 = ppVar5->min;
            uVar14 = 0x80000000 - iVar16;
            if (iVar16 != iVar31 && SBORROW4(iVar16,iVar31) == iVar16 + open < 0) {
              uVar14 = open | 0x80000000;
            }
            pvVar6 = (profile->profile32).matches;
            uVar12 = 0x7ffffffe - ppVar5->max;
            local_1b8._0_4_ = uVar12;
            pvVar7 = (profile->profile32).similar;
            ppVar17 = parasail_result_new_table3((uint)((ulong)uVar25 + 3) & 0x7ffffffc,s2Len);
            if (ppVar17 != (parasail_result_t *)0x0) {
              iVar16 = (int)(uVar28 / uVar34);
              ppVar17->flag = ppVar17->flag | 0x4430401;
              b = parasail_memalign___m128i(0x10,uVar34);
              b_00 = parasail_memalign___m128i(0x10,uVar34);
              b_01 = parasail_memalign___m128i(0x10,uVar34);
              b_02 = parasail_memalign___m128i(0x10,uVar34);
              ptr = parasail_memalign___m128i(0x10,uVar34);
              b_03 = parasail_memalign___m128i(0x10,uVar34);
              b_04 = parasail_memalign___m128i(0x10,uVar34);
              b_05 = parasail_memalign___m128i(0x10,uVar34);
              ptr_00 = parasail_memalign___m128i(0x10,uVar34);
              ptr_01 = parasail_memalign___m128i(0x10,uVar34);
              ptr_02 = parasail_memalign___m128i(0x10,uVar34);
              ptr_03 = parasail_memalign___m128i(0x10,uVar34);
              ptr_04 = parasail_memalign___m128i(0x10,uVar34);
              ptr_05 = parasail_memalign___m128i(0x10,uVar34);
              ptr_06 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = ptr_00 == (__m128i *)0x0;
              auVar36._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar36._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar56._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
              auVar56._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
              auVar36 = packssdw(auVar36,auVar56);
              auVar47._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar47._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
              auVar65._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
              auVar65._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
              auVar47 = packssdw(auVar47,auVar65);
              auVar36 = packssdw(auVar36,auVar47);
              if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                    ptr_05 != (__m128i *)0x0) &&
                   ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                   ptr_02 != (__m128i *)0x0)) && ptr_06 != (int32_t *)0x0) &&
                  ((((((((((((((((auVar36 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar36 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar36 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar36 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar36 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar36 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar36 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar36 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar36 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar36 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar36 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar36 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar36 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar36[0xf])) {
                iVar13 = s2Len + -1;
                uVar14 = uVar14 + 1;
                iVar29 = (int)uVar34;
                iVar15 = -(iVar29 * gap);
                c[0] = uVar34;
                parasail_memset___m128i(b_03,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar34;
                parasail_memset___m128i(b_04,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar34;
                parasail_memset___m128i(b_05,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar34;
                parasail_memset___m128i(b,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar34;
                parasail_memset___m128i(b_00,c_03,len);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar34;
                parasail_memset___m128i(b_01,c_04,len);
                c_05[1] = extraout_RDX_05;
                c_05[0] = uVar34;
                parasail_memset___m128i(b_02,c_05,len);
                auVar99._4_4_ = gap;
                auVar99._0_4_ = gap;
                auVar99._8_4_ = gap;
                auVar99._12_4_ = gap;
                auVar51._4_4_ = -open;
                auVar51._0_4_ = -open;
                auVar51._8_4_ = -open;
                auVar51._12_4_ = -open;
                uVar45 = CONCAT44(0,iVar29 - 1);
                local_208._8_8_ = local_208._0_8_;
                local_208._0_8_ = uVar45;
                lVar22 = uVar45 << 4;
                auVar36 = pmovsxbd(extraout_XMM0,0x1010101);
                uVar23 = uVar34;
                do {
                  *(undefined1 (*) [16])((long)*ptr_04 + lVar22) = auVar51;
                  *(undefined1 (*) [16])((long)*ptr_05 + lVar22) = auVar36;
                  auVar57._0_4_ = auVar51._0_4_ - gap;
                  auVar57._4_4_ = auVar51._4_4_ - gap;
                  auVar57._8_4_ = auVar51._8_4_ - gap;
                  auVar57._12_4_ = auVar51._12_4_ - gap;
                  auVar37._0_4_ = auVar36._0_4_ + 1;
                  auVar37._4_4_ = auVar36._4_4_ + 1;
                  auVar37._8_4_ = auVar36._8_4_ + 1;
                  auVar37._12_4_ = auVar36._12_4_ + 1;
                  lVar22 = lVar22 + -0x10;
                  iVar103 = (int)uVar23;
                  uVar25 = iVar103 - 1;
                  uVar23 = (ulong)uVar25;
                  auVar36 = auVar37;
                  auVar51 = auVar57;
                } while (uVar25 != 0 && 0 < iVar103);
                auVar94._8_4_ = iVar29;
                auVar94._0_8_ = uVar34;
                auVar94._12_4_ = 0;
                auVar36 = pmovsxbq(auVar57,0x302);
                auVar47 = pmuldq(auVar36,auVar94);
                auVar36 = pmuldq(auVar94,_DAT_00903a90);
                uVar23 = 0;
                palVar26 = ptr;
                do {
                  auVar104._8_4_ = (int)uVar23;
                  auVar104._0_8_ = uVar23;
                  auVar104._12_4_ = (int)(uVar23 >> 0x20);
                  auVar55._0_4_ = (undefined4)(uVar23 + auVar36._0_8_);
                  auVar55._4_4_ = (int)(auVar104._8_8_ + auVar36._8_8_);
                  auVar55._8_4_ = (int)(auVar47._0_8_ + uVar23);
                  auVar55._12_4_ = (int)(auVar47._8_8_ + auVar104._8_8_);
                  auVar56 = pmulld(auVar55,auVar99);
                  *(int *)*palVar26 = iVar31 - auVar56._0_4_;
                  *(int *)((long)*palVar26 + 4) = iVar31 - auVar56._4_4_;
                  *(int *)(*palVar26 + 1) = iVar31 - auVar56._8_4_;
                  *(int *)((long)*palVar26 + 0xc) = iVar31 - auVar56._12_4_;
                  uVar23 = uVar23 + 1;
                  palVar26 = palVar26 + 1;
                } while (uVar34 != uVar23);
                *ptr_06 = 0;
                auVar56 = _DAT_00906ca0;
                lVar22 = uVar62 - 1;
                auVar38._8_4_ = (int)lVar22;
                auVar38._0_8_ = lVar22;
                auVar38._12_4_ = (int)((ulong)lVar22 >> 0x20);
                uVar23 = 0;
                auVar36 = pmovsxbq(auVar36,0x302);
                auVar47 = pmovsxbq(auVar47,0x100);
                auVar38 = auVar38 ^ _DAT_00906ca0;
                do {
                  uVar54 = auVar56._0_8_;
                  lVar22 = auVar38._0_8_;
                  if ((bool)(~(lVar22 < (long)(uVar23 ^ uVar54)) & 1)) {
                    ptr_06[uVar23 + 1] = iVar31;
                  }
                  auVar75._8_4_ = (int)uVar23;
                  auVar75._0_8_ = uVar23;
                  auVar75._12_4_ = (int)(uVar23 >> 0x20);
                  if ((long)((auVar75._8_8_ | auVar47._8_8_) ^ auVar56._8_8_) <= auVar38._8_8_) {
                    ptr_06[uVar23 + 2] = iVar31 - gap;
                  }
                  if ((long)((uVar23 | auVar36._0_8_) ^ uVar54) <= lVar22) {
                    ptr_06[uVar23 + 3] = gap * -2 + iVar31;
                    ptr_06[uVar23 + 4] = gap * -3 + iVar31;
                  }
                  uVar23 = uVar23 + 4;
                  iVar31 = iVar31 + gap * -4;
                } while ((s2Len + 3U & 0xfffffffc) != uVar23);
                palVar26 = ptr + uVar45;
                palVar18 = b_03 + uVar45;
                palVar19 = b_04 + uVar45;
                palVar20 = b_05 + uVar45;
                lVar32 = uVar34 * uVar62;
                lVar22 = lVar32 * 4;
                lVar33 = lVar32 * 8;
                lVar32 = lVar32 * 0xc;
                local_160 = 0;
                uVar23 = 0;
                uVar25 = uVar14;
                uVar67 = uVar14;
                uVar69 = uVar14;
                uVar71 = uVar14;
                local_148 = uVar12;
                uStack_144 = uVar12;
                uStack_140 = uVar12;
                uStack_13c = uVar12;
                do {
                  iStack_114 = (int)(*palVar19)[0];
                  iStack_110 = *(int *)((long)*palVar19 + 4);
                  iStack_10c = (int)(*palVar19)[1];
                  iStack_124 = (int)(*palVar20)[0];
                  iStack_120 = *(int *)((long)*palVar20 + 4);
                  iStack_11c = (int)(*palVar20)[1];
                  local_118 = 0;
                  local_128 = 0;
                  lVar24 = (long)ppVar5->mapper[(byte)s2[uVar23]] * uVar34 * 0x10;
                  uVar73 = uVar14 - (int)(*ptr_04)[0];
                  uVar77 = uVar14 - *(int *)((long)*ptr_04 + 4);
                  uVar79 = uVar14 - (int)(*ptr_04)[1];
                  uVar81 = uVar14 - *(int *)((long)*ptr_04 + 0xc);
                  auVar65 = ZEXT816(0);
                  lVar30 = 0;
                  local_1c8 = (undefined1  [16])0x0;
                  local_1d8 = (undefined1  [16])0x0;
                  auVar36 = local_1b8;
                  auVar47 = in_XMM7;
                  auVar56 = local_208;
                  auVar105._0_4_ = uVar14;
                  auVar105._4_4_ = uVar14;
                  auVar105._8_4_ = uVar14;
                  uVar102 = uVar14;
                  local_1b8._0_4_ = 0;
                  local_1b8._4_4_ = (int)(*palVar18)[0];
                  local_1b8._8_4_ = *(int *)((long)*palVar18 + 4);
                  local_1b8._12_4_ = (int)(*palVar18)[1];
                  local_208._0_4_ = ptr_06[uVar23];
                  local_208._4_4_ = (int)(*palVar26)[0];
                  local_208._8_4_ = *(int *)((long)*palVar26 + 4);
                  iVar31 = (int)(*palVar26)[1];
                  do {
                    pauVar3 = (undefined1 (*) [12])((long)*ptr + lVar30);
                    auVar9 = *pauVar3;
                    iVar103 = *(int *)pauVar3[1];
                    auVar99 = *(undefined1 (*) [16])((long)*b_03 + lVar30);
                    piVar1 = (int *)((long)*b + lVar30);
                    iVar83 = *(int *)*pauVar3 - open;
                    iVar86 = *(int *)(*pauVar3 + 4) - open;
                    iVar87 = *(int *)(*pauVar3 + 8) - open;
                    iVar88 = iVar103 - open;
                    iVar90 = *piVar1 - gap;
                    iVar91 = piVar1[1] - gap;
                    iVar92 = piVar1[2] - gap;
                    iVar93 = piVar1[3] - gap;
                    auVar39._0_4_ = -(uint)(iVar90 < iVar83);
                    auVar39._4_4_ = -(uint)(iVar91 < iVar86);
                    auVar39._8_4_ = -(uint)(iVar92 < iVar87);
                    auVar39._12_4_ = -(uint)(iVar93 < iVar88);
                    auVar104 = blendvps(*(undefined1 (*) [16])((long)*b_00 + lVar30),auVar99,auVar39
                                       );
                    auVar51 = *(undefined1 (*) [16])((long)*b_04 + lVar30);
                    auVar94 = blendvps(*(undefined1 (*) [16])((long)*b_01 + lVar30),auVar51,auVar39)
                    ;
                    auVar37 = *(undefined1 (*) [16])((long)*b_05 + lVar30);
                    auVar57 = blendvps(*(undefined1 (*) [16])((long)*b_02 + lVar30),auVar37,auVar39)
                    ;
                    piVar1 = (int *)((long)*ptr_04 + lVar30);
                    iVar74 = uVar73 + *piVar1;
                    iVar78 = uVar77 + piVar1[1];
                    iVar80 = uVar79 + piVar1[2];
                    iVar82 = uVar81 + piVar1[3];
                    auVar40._0_4_ = -(uint)((int)auVar105._0_4_ < iVar74);
                    auVar40._4_4_ = -(uint)((int)auVar105._4_4_ < iVar78);
                    auVar40._8_4_ = -(uint)((int)auVar105._8_4_ < iVar80);
                    auVar40._12_4_ = -(uint)((int)uVar102 < iVar82);
                    local_1d8 = blendvps(local_1d8,auVar36,auVar40);
                    local_1c8 = blendvps(local_1c8,auVar56,auVar40);
                    uVar73 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
                    uVar77 = (uint)(iVar91 < iVar86) * iVar86 | (uint)(iVar91 >= iVar86) * iVar91;
                    uVar79 = (uint)(iVar92 < iVar87) * iVar87 | (uint)(iVar92 >= iVar87) * iVar92;
                    uVar81 = (uint)(iVar93 < iVar88) * iVar88 | (uint)(iVar93 >= iVar88) * iVar93;
                    auVar105._0_4_ =
                         (iVar74 < (int)auVar105._0_4_) * auVar105._0_4_ |
                         (uint)(iVar74 >= (int)auVar105._0_4_) * iVar74;
                    auVar105._4_4_ =
                         (iVar78 < (int)auVar105._4_4_) * auVar105._4_4_ |
                         (uint)(iVar78 >= (int)auVar105._4_4_) * iVar78;
                    auVar105._8_4_ =
                         (iVar80 < (int)auVar105._8_4_) * auVar105._8_4_ |
                         (uint)(iVar80 >= (int)auVar105._8_4_) * iVar80;
                    uVar102 = (iVar82 < (int)uVar102) * uVar102 |
                              (uint)(iVar82 >= (int)uVar102) * iVar82;
                    piVar1 = (int *)((long)*ptr_05 + lVar30);
                    auVar89._0_4_ = auVar47._0_4_ + *piVar1;
                    auVar89._4_4_ = auVar47._4_4_ + piVar1[1];
                    auVar89._8_4_ = auVar47._8_4_ + piVar1[2];
                    auVar89._12_4_ = auVar47._12_4_ + piVar1[3];
                    auVar65 = blendvps(auVar65,auVar89,auVar40);
                    piVar1 = (int *)((long)pvVar4 + lVar30 + lVar24);
                    iVar74 = local_208._0_4_ + *piVar1;
                    local_208._4_4_ = local_208._4_4_ + piVar1[1];
                    local_208._8_4_ = local_208._8_4_ + piVar1[2];
                    iVar31 = iVar31 + piVar1[3];
                    piVar1 = (int *)((long)pvVar6 + lVar30 + lVar24);
                    auVar98._0_4_ = local_1b8._0_4_ + *piVar1;
                    auVar98._4_4_ = local_1b8._4_4_ + piVar1[1];
                    auVar98._8_4_ = local_1b8._8_4_ + piVar1[2];
                    auVar98._12_4_ = local_1b8._12_4_ + piVar1[3];
                    piVar1 = (int *)((long)pvVar7 + lVar30 + lVar24);
                    auVar95._0_4_ = local_118 + *piVar1;
                    auVar95._4_4_ = iStack_114 + piVar1[1];
                    auVar95._8_4_ = iStack_110 + piVar1[2];
                    auVar95._12_4_ = iStack_10c + piVar1[3];
                    auVar41._0_4_ = -(uint)(iVar74 < (int)uVar73);
                    auVar41._4_4_ = -(uint)((int)local_208._4_4_ < (int)uVar77);
                    auVar41._8_4_ = -(uint)((int)local_208._8_4_ < (int)uVar79);
                    auVar41._12_4_ = -(uint)(iVar31 < (int)uVar81);
                    auVar36 = blendvps(auVar98,auVar104,auVar41);
                    auVar56 = blendvps(auVar95,auVar94,auVar41);
                    auVar58._0_4_ = auVar57._0_4_ + 1;
                    auVar58._4_4_ = auVar57._4_4_ + 1;
                    auVar58._8_4_ = auVar57._8_4_ + 1;
                    auVar58._12_4_ = auVar57._12_4_ + 1;
                    auVar48._0_4_ = local_128 + 1;
                    auVar48._4_4_ = iStack_124 + 1;
                    auVar48._8_4_ = iStack_120 + 1;
                    auVar48._12_4_ = iStack_11c + 1;
                    auVar47 = blendvps(auVar48,auVar58,auVar41);
                    puVar2 = (uint *)((long)*b + lVar30);
                    *puVar2 = uVar73;
                    puVar2[1] = uVar77;
                    puVar2[2] = uVar79;
                    puVar2[3] = uVar81;
                    *(undefined1 (*) [16])((long)*b_00 + lVar30) = auVar104;
                    *(undefined1 (*) [16])((long)*b_01 + lVar30) = auVar94;
                    *(undefined1 (*) [16])((long)*b_02 + lVar30) = auVar58;
                    uVar73 = (uint)((int)uVar73 < iVar74) * iVar74 |
                             ((int)uVar73 >= iVar74) * uVar73;
                    uVar77 = (uint)((int)uVar77 < (int)local_208._4_4_) * local_208._4_4_ |
                             ((int)uVar77 >= (int)local_208._4_4_) * uVar77;
                    uVar79 = (uint)((int)uVar79 < (int)local_208._8_4_) * local_208._8_4_ |
                             ((int)uVar79 >= (int)local_208._8_4_) * uVar79;
                    uVar81 = (uint)((int)uVar81 < iVar31) * iVar31 |
                             ((int)uVar81 >= iVar31) * uVar81;
                    piVar1 = (int *)((long)*ptr + lVar30);
                    *piVar1 = iVar74;
                    piVar1[1] = local_208._4_4_;
                    piVar1[2] = local_208._8_4_;
                    piVar1[3] = iVar31;
                    *(undefined1 (*) [16])((long)*b_03 + lVar30) = auVar98;
                    *(undefined1 (*) [16])((long)*b_04 + lVar30) = auVar95;
                    *(undefined1 (*) [16])((long)*b_05 + lVar30) = auVar48;
                    lVar30 = lVar30 + 0x10;
                    local_128 = auVar37._0_4_;
                    iStack_124 = auVar37._4_4_;
                    iStack_120 = auVar37._8_4_;
                    iStack_11c = auVar37._12_4_;
                    local_118 = auVar51._0_4_;
                    iStack_114 = auVar51._4_4_;
                    iStack_110 = auVar51._8_4_;
                    iStack_10c = auVar51._12_4_;
                    local_1b8._0_4_ = auVar99._0_4_;
                    local_1b8._4_4_ = auVar99._4_4_;
                    local_1b8._8_4_ = auVar99._8_4_;
                    local_1b8._12_4_ = auVar99._12_4_;
                    local_208._0_4_ = auVar9._0_4_;
                    local_208._4_4_ = auVar9._4_4_;
                    local_208._8_4_ = auVar9._8_4_;
                    iVar31 = iVar103;
                  } while (uVar34 << 4 != lVar30);
                  local_1b8._0_8_ = auVar36._0_8_ << 0x20;
                  local_1b8._8_8_ = auVar36._8_8_ << 0x20 | auVar36._0_8_ >> 0x20;
                  local_208._0_8_ = auVar56._0_8_ << 0x20;
                  local_208._8_8_ = auVar56._8_8_ << 0x20 | auVar56._0_8_ >> 0x20;
                  in_XMM7._0_8_ = auVar47._0_8_ << 0x20;
                  in_XMM7._8_8_ = auVar47._8_8_ << 0x20 | auVar47._0_8_ >> 0x20;
                  iVar31 = ptr_06[uVar23 + 1];
                  uVar23 = uVar23 + 1;
                  iVar103 = (int)(*ptr_04)[0] + iVar31;
                  iVar74 = *(int *)((long)*ptr_04 + 4) + uVar73;
                  iVar78 = (int)(*ptr_04)[1] + uVar77;
                  iVar80 = *(int *)((long)*ptr_04 + 0xc) + uVar79;
                  auVar42._0_4_ = -(uint)(iVar103 < (int)auVar105._0_4_);
                  auVar42._4_4_ = -(uint)(iVar74 < (int)auVar105._4_4_);
                  auVar42._8_4_ = -(uint)(iVar78 < (int)auVar105._8_4_);
                  auVar42._12_4_ = -(uint)(iVar80 < (int)uVar102);
                  auVar105._0_4_ =
                       (iVar103 < (int)auVar105._0_4_) * auVar105._0_4_ |
                       (uint)(iVar103 >= (int)auVar105._0_4_) * iVar103;
                  auVar105._4_4_ =
                       (iVar74 < (int)auVar105._4_4_) * auVar105._4_4_ |
                       (uint)(iVar74 >= (int)auVar105._4_4_) * iVar74;
                  auVar105._8_4_ =
                       (iVar78 < (int)auVar105._8_4_) * auVar105._8_4_ |
                       (uint)(iVar78 >= (int)auVar105._8_4_) * iVar78;
                  auVar105._12_4_ =
                       (iVar80 < (int)uVar102) * uVar102 | (uint)(iVar80 >= (int)uVar102) * iVar80;
                  auVar56 = blendvps(local_1b8,local_1d8,auVar42);
                  auVar99 = blendvps(local_208,local_1c8,auVar42);
                  auVar84._4_4_ = *(int *)((long)*ptr_05 + 4) + auVar47._0_4_;
                  auVar84._0_4_ = (int)(*ptr_05)[0];
                  auVar84._8_4_ = (int)(*ptr_05)[1] + auVar47._4_4_;
                  auVar84._12_4_ = *(int *)((long)*ptr_05 + 0xc) + auVar47._8_4_;
                  auVar36 = blendvps(auVar84,auVar65,auVar42);
                  bVar11 = true;
                  do {
                    bVar21 = bVar11;
                    auVar96._0_8_ = auVar56._0_8_ << 0x20;
                    auVar96._8_8_ = auVar56._8_8_ << 0x20 | auVar56._0_8_ >> 0x20;
                    auVar100._0_8_ = auVar99._0_8_ << 0x20;
                    auVar100._8_8_ = auVar99._8_8_ << 0x20 | auVar99._0_8_ >> 0x20;
                    auVar10._4_4_ = auVar36._4_4_ + iVar29;
                    auVar10._0_4_ = auVar36._0_4_ + iVar29;
                    auVar10._8_4_ = auVar36._8_4_ + iVar29;
                    auVar10._12_4_ = 0;
                    iVar74 = auVar105._0_4_;
                    iVar78 = iVar74 + iVar15;
                    iVar80 = auVar105._4_4_;
                    iVar83 = auVar105._8_4_;
                    iVar82 = iVar80 + iVar15;
                    iVar86 = iVar83 + iVar15;
                    auVar43._0_4_ = -(uint)((int)uVar14 < iVar74);
                    auVar43._4_4_ = -(uint)(iVar78 < iVar80);
                    iVar103 = auVar105._12_4_;
                    auVar43._8_4_ = -(uint)(iVar82 < iVar83);
                    auVar43._12_4_ = -(uint)(iVar86 < iVar103);
                    auVar105._0_4_ =
                         (uint)((int)uVar14 < iVar74) * iVar74 | ((int)uVar14 >= iVar74) * uVar14;
                    auVar105._4_4_ =
                         (uint)(iVar78 < iVar80) * iVar80 | (uint)(iVar78 >= iVar80) * iVar78;
                    auVar105._8_4_ =
                         (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
                    auVar105._12_4_ =
                         (uint)(iVar86 < iVar103) * iVar103 | (uint)(iVar86 >= iVar103) * iVar86;
                    auVar56 = blendvps(auVar96,auVar56,auVar43);
                    auVar99 = blendvps(auVar100,auVar99,auVar43);
                    auVar36 = blendvps(auVar10 << 0x20,auVar36,auVar43);
                    bVar11 = false;
                  } while (bVar21);
                  auVar44._0_4_ = -(uint)(iVar31 < (int)uVar14);
                  auVar44._4_4_ = -(uint)((int)uVar73 < (int)auVar105._0_4_);
                  auVar44._8_4_ = -(uint)((int)uVar77 < (int)auVar105._4_4_);
                  auVar44._12_4_ = -(uint)((int)uVar79 < (int)auVar105._8_4_);
                  auVar97._0_8_ = auVar56._0_8_ << 0x20;
                  auVar97._8_8_ = auVar56._8_8_ << 0x20 | auVar56._0_8_ >> 0x20;
                  auVar47 = blendvps(local_1b8,auVar97,auVar44);
                  auVar101._0_8_ = auVar99._0_8_ << 0x20;
                  auVar101._8_8_ = auVar99._8_8_ << 0x20 | auVar99._0_8_ >> 0x20;
                  auVar56 = blendvps(local_208,auVar101,auVar44);
                  uVar81 = (iVar31 < (int)uVar14) * uVar14 | (uint)(iVar31 >= (int)uVar14) * iVar31;
                  uVar73 = ((int)uVar73 < (int)auVar105._0_4_) * auVar105._0_4_ |
                           ((int)uVar73 >= (int)auVar105._0_4_) * uVar73;
                  uVar77 = ((int)uVar77 < (int)auVar105._4_4_) * auVar105._4_4_ |
                           ((int)uVar77 >= (int)auVar105._4_4_) * uVar77;
                  uVar79 = ((int)uVar79 < (int)auVar105._8_4_) * auVar105._8_4_ |
                           ((int)uVar79 >= (int)auVar105._8_4_) * uVar79;
                  auVar85._0_8_ = auVar36._0_8_ << 0x20;
                  auVar85._8_8_ = auVar36._8_8_ << 0x20 | auVar36._0_8_ >> 0x20;
                  auVar36 = blendvps(in_XMM7,auVar85,auVar44);
                  lVar30 = 0;
                  lVar24 = local_160;
                  uVar102 = uVar14;
                  do {
                    iVar31 = uVar81 - open;
                    iVar103 = uVar73 - open;
                    iVar74 = uVar77 - open;
                    iVar78 = uVar79 - open;
                    iVar80 = uVar102 - gap;
                    iVar82 = auVar105._0_4_ - gap;
                    iVar83 = auVar105._4_4_ - gap;
                    iVar86 = auVar105._8_4_ - gap;
                    auVar49._0_4_ = -(uint)(iVar80 < iVar31);
                    auVar49._4_4_ = -(uint)(iVar82 < iVar103);
                    auVar49._8_4_ = -(uint)(iVar83 < iVar74);
                    auVar49._12_4_ = -(uint)(iVar86 < iVar78);
                    auVar97 = blendvps(auVar97,auVar47,auVar49);
                    puVar2 = (uint *)((long)*ptr + lVar30);
                    uVar64 = *puVar2;
                    uVar68 = puVar2[1];
                    uVar70 = puVar2[2];
                    uVar72 = puVar2[3];
                    auVar101 = blendvps(auVar101,auVar56,auVar49);
                    uVar102 = (uint)(iVar31 < iVar80) * iVar80 | (uint)(iVar31 >= iVar80) * iVar31;
                    auVar105._0_4_ =
                         (uint)(iVar103 < iVar82) * iVar82 | (uint)(iVar103 >= iVar82) * iVar103;
                    auVar105._4_4_ =
                         (uint)(iVar74 < iVar83) * iVar83 | (uint)(iVar74 >= iVar83) * iVar74;
                    auVar105._8_4_ =
                         (uint)(iVar78 < iVar86) * iVar86 | (uint)(iVar78 >= iVar86) * iVar78;
                    auVar36 = blendvps(auVar85,auVar36,auVar49);
                    piVar1 = (int *)((long)*b + lVar30);
                    iVar31 = *piVar1;
                    iVar103 = piVar1[1];
                    iVar74 = piVar1[2];
                    iVar78 = piVar1[3];
                    uVar53 = (iVar31 < (int)uVar64) * uVar64 |
                             (uint)(iVar31 >= (int)uVar64) * iVar31;
                    uVar60 = (iVar103 < (int)uVar68) * uVar68 |
                             (uint)(iVar103 >= (int)uVar68) * iVar103;
                    uVar61 = (iVar74 < (int)uVar70) * uVar70 |
                             (uint)(iVar74 >= (int)uVar70) * iVar74;
                    uVar63 = (iVar78 < (int)uVar72) * uVar72 |
                             (uint)(iVar78 >= (int)uVar72) * iVar78;
                    uVar81 = ((int)uVar53 < (int)uVar102) * uVar102 |
                             ((int)uVar53 >= (int)uVar102) * uVar53;
                    uVar73 = ((int)uVar60 < (int)auVar105._0_4_) * auVar105._0_4_ |
                             ((int)uVar60 >= (int)auVar105._0_4_) * uVar60;
                    uVar77 = ((int)uVar61 < (int)auVar105._4_4_) * auVar105._4_4_ |
                             ((int)uVar61 >= (int)auVar105._4_4_) * uVar61;
                    uVar79 = ((int)uVar63 < (int)auVar105._8_4_) * auVar105._8_4_ |
                             ((int)uVar63 >= (int)auVar105._8_4_) * uVar63;
                    auVar52._0_4_ = -(uint)(uVar64 == uVar81);
                    auVar52._4_4_ = -(uint)(uVar68 == uVar73);
                    auVar52._8_4_ = -(uint)(uVar70 == uVar77);
                    auVar52._12_4_ = -(uint)(uVar72 == uVar79);
                    auVar59._0_4_ = -(uint)((int)uVar102 < (int)uVar53);
                    auVar59._4_4_ = -(uint)((int)auVar105._0_4_ < (int)uVar60);
                    auVar59._8_4_ = -(uint)((int)auVar105._4_4_ < (int)uVar61);
                    auVar59._12_4_ = -(uint)((int)auVar105._8_4_ < (int)uVar63);
                    auVar47 = blendvps(auVar97,*(undefined1 (*) [16])((long)*b_00 + lVar30),auVar59)
                    ;
                    auVar47 = blendvps(auVar47,*(undefined1 (*) [16])((long)*b_03 + lVar30),auVar52)
                    ;
                    auVar56 = blendvps(auVar101,*(undefined1 (*) [16])((long)*b_01 + lVar30),auVar59
                                      );
                    auVar56 = blendvps(auVar56,*(undefined1 (*) [16])((long)*b_04 + lVar30),auVar52)
                    ;
                    auVar85._0_4_ = auVar36._0_4_ + 1;
                    auVar85._4_4_ = auVar36._4_4_ + 1;
                    auVar85._8_4_ = auVar36._8_4_ + 1;
                    auVar85._12_4_ = auVar36._12_4_ + 1;
                    auVar36 = blendvps(auVar85,*(undefined1 (*) [16])((long)*b_02 + lVar30),auVar59)
                    ;
                    auVar36 = blendvps(auVar36,*(undefined1 (*) [16])((long)*b_05 + lVar30),auVar52)
                    ;
                    puVar2 = (uint *)((long)*ptr + lVar30);
                    *puVar2 = uVar81;
                    puVar2[1] = uVar73;
                    puVar2[2] = uVar77;
                    puVar2[3] = uVar79;
                    *(undefined1 (*) [16])((long)*b_03 + lVar30) = auVar47;
                    *(undefined1 (*) [16])((long)*b_04 + lVar30) = auVar56;
                    *(undefined1 (*) [16])((long)*b_05 + lVar30) = auVar36;
                    lVar27 = *((ppVar17->field_4).trace)->trace_del_table;
                    *(uint *)(lVar27 + lVar24) = uVar81;
                    lVar27 = lVar27 + lVar24;
                    *(uint *)(lVar22 + lVar27) = uVar73;
                    *(uint *)(lVar33 + lVar27) = uVar77;
                    *(uint *)(lVar32 + lVar27) = uVar79;
                    lVar27 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 8);
                    iVar31 = auVar47._0_4_;
                    *(int *)(lVar27 + lVar24) = iVar31;
                    lVar27 = lVar27 + lVar24;
                    uVar8 = extractps(auVar47,1);
                    *(undefined8 *)(lVar22 + lVar27) = uVar8;
                    uVar8 = extractps(auVar47,2);
                    *(undefined8 *)(lVar33 + lVar27) = uVar8;
                    uVar8 = extractps(auVar47,3);
                    *(undefined8 *)(lVar32 + lVar27) = uVar8;
                    lVar27 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x10);
                    iVar74 = auVar56._0_4_;
                    *(int *)(lVar27 + lVar24) = iVar74;
                    lVar27 = lVar27 + lVar24;
                    uVar8 = extractps(auVar56,1);
                    *(undefined8 *)(lVar22 + lVar27) = uVar8;
                    uVar8 = extractps(auVar56,2);
                    *(undefined8 *)(lVar33 + lVar27) = uVar8;
                    uVar8 = extractps(auVar56,3);
                    *(undefined8 *)(lVar32 + lVar27) = uVar8;
                    lVar27 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x18);
                    iVar103 = auVar36._0_4_;
                    *(int *)(lVar27 + lVar24) = iVar103;
                    lVar27 = lVar27 + lVar24;
                    uVar8 = extractps(auVar36,1);
                    *(undefined8 *)(lVar22 + lVar27) = uVar8;
                    uVar8 = extractps(auVar36,2);
                    *(undefined8 *)(lVar33 + lVar27) = uVar8;
                    uVar8 = extractps(auVar36,3);
                    *(undefined8 *)(lVar32 + lVar27) = uVar8;
                    local_148 = ((int)uVar81 < (int)local_148) * uVar81 |
                                ((int)uVar81 >= (int)local_148) * local_148;
                    uStack_144 = ((int)uVar73 < (int)uStack_144) * uVar73 |
                                 ((int)uVar73 >= (int)uStack_144) * uStack_144;
                    uStack_140 = ((int)uVar77 < (int)uStack_140) * uVar77 |
                                 ((int)uVar77 >= (int)uStack_140) * uStack_140;
                    uStack_13c = ((int)uVar79 < (int)uStack_13c) * uVar79 |
                                 ((int)uVar79 >= (int)uStack_13c) * uStack_13c;
                    uVar25 = ((int)uVar25 < (int)uVar81) * uVar81 |
                             ((int)uVar25 >= (int)uVar81) * uVar25;
                    uVar67 = ((int)uVar67 < (int)uVar73) * uVar73 |
                             ((int)uVar67 >= (int)uVar73) * uVar67;
                    uVar69 = ((int)uVar69 < (int)uVar77) * uVar77 |
                             ((int)uVar69 >= (int)uVar77) * uVar69;
                    uVar71 = ((int)uVar71 < (int)uVar79) * uVar79 |
                             ((int)uVar71 >= (int)uVar79) * uVar71;
                    uVar25 = (uint)((int)uVar25 < iVar31) * iVar31 |
                             ((int)uVar25 >= iVar31) * uVar25;
                    iVar31 = auVar47._4_4_;
                    uVar67 = (uint)((int)uVar67 < iVar31) * iVar31 |
                             ((int)uVar67 >= iVar31) * uVar67;
                    iVar31 = auVar47._8_4_;
                    uVar69 = (uint)((int)uVar69 < iVar31) * iVar31 |
                             ((int)uVar69 >= iVar31) * uVar69;
                    iVar31 = auVar47._12_4_;
                    uVar71 = (uint)((int)uVar71 < iVar31) * iVar31 |
                             ((int)uVar71 >= iVar31) * uVar71;
                    uVar64 = (uint)(iVar74 < iVar103) * iVar103 | (uint)(iVar74 >= iVar103) * iVar74
                    ;
                    iVar31 = auVar36._4_4_;
                    iVar103 = auVar56._4_4_;
                    uVar68 = (uint)(iVar103 < iVar31) * iVar31 | (uint)(iVar103 >= iVar31) * iVar103
                    ;
                    iVar31 = auVar36._8_4_;
                    iVar103 = auVar56._8_4_;
                    iVar74 = auVar56._12_4_;
                    uVar70 = (uint)(iVar103 < iVar31) * iVar31 | (uint)(iVar103 >= iVar31) * iVar103
                    ;
                    iVar31 = auVar36._12_4_;
                    uVar72 = (uint)(iVar74 < iVar31) * iVar31 | (uint)(iVar74 >= iVar31) * iVar74;
                    uVar25 = ((int)uVar64 < (int)uVar25) * uVar25 |
                             ((int)uVar64 >= (int)uVar25) * uVar64;
                    uVar67 = ((int)uVar68 < (int)uVar67) * uVar67 |
                             ((int)uVar68 >= (int)uVar67) * uVar68;
                    uVar69 = ((int)uVar70 < (int)uVar69) * uVar69 |
                             ((int)uVar70 >= (int)uVar69) * uVar70;
                    uVar71 = ((int)uVar72 < (int)uVar71) * uVar71 |
                             ((int)uVar72 >= (int)uVar71) * uVar72;
                    lVar30 = lVar30 + 0x10;
                    lVar24 = lVar24 + uVar62 * 4;
                  } while (uVar34 << 4 != lVar30);
                  local_160 = local_160 + 4;
                } while (uVar23 != uVar62);
                iVar31 = (int)uVar35 * 0x10;
                uVar62 = ptr[uVar35][1];
                uVar34 = b_03[uVar35][1];
                uVar23 = b_04[uVar35][1];
                uVar45 = b_05[uVar35][1];
                if (iVar16 < 3) {
                  iVar31 = 0;
                  uVar54 = ptr[uVar35][0];
                  uVar50 = b_03[uVar35][0];
                  uVar46 = b_04[uVar35][0];
                  uVar35 = b_05[uVar35][0];
                  do {
                    uVar62 = uVar62 << 0x20 | uVar54 >> 0x20;
                    uVar34 = uVar34 << 0x20 | uVar50 >> 0x20;
                    uVar23 = uVar23 << 0x20 | uVar46 >> 0x20;
                    uVar45 = uVar45 << 0x20 | uVar35 >> 0x20;
                    iVar31 = iVar31 + 1;
                    uVar54 = uVar54 << 0x20;
                    uVar50 = uVar50 << 0x20;
                    uVar46 = uVar46 << 0x20;
                    uVar35 = uVar35 << 0x20;
                  } while (iVar31 < 3 - iVar16);
                }
                auVar76._0_4_ = -(uint)((int)local_148 < (int)uVar14);
                auVar76._4_4_ = -(uint)((int)uStack_144 < (int)uVar14);
                auVar76._8_4_ = -(uint)((int)uStack_140 < (int)uVar14);
                auVar76._12_4_ = -(uint)((int)uStack_13c < (int)uVar14);
                auVar66._0_4_ = -(uint)((int)uVar12 < (int)uVar25);
                auVar66._4_4_ = -(uint)((int)uVar12 < (int)uVar67);
                auVar66._8_4_ = -(uint)((int)uVar12 < (int)uVar69);
                auVar66._12_4_ = -(uint)((int)uVar12 < (int)uVar71);
                iVar16 = movmskps(iVar31,auVar66 | auVar76);
                if (iVar16 == 0) {
                  iVar16 = (int)(uVar62 >> 0x20);
                  iVar31 = (int)(uVar34 >> 0x20);
                  iVar15 = (int)(uVar23 >> 0x20);
                  iVar29 = (int)(uVar45 >> 0x20);
                }
                else {
                  *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                  iVar16 = 0;
                  iVar31 = 0;
                  iVar15 = 0;
                  iVar29 = 0;
                  iVar13 = 0;
                  uVar28 = 0;
                }
                ppVar17->score = iVar16;
                ppVar17->end_query = uVar28;
                ppVar17->end_ref = iVar13;
                ((ppVar17->field_4).stats)->matches = iVar31;
                ((ppVar17->field_4).stats)->similar = iVar15;
                ((ppVar17->field_4).stats)->length = iVar29;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar17;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32(vHp, vE);
            vH = _mm_max_epi32(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}